

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Territory __thiscall QTzTimeZonePrivate::territory(QTzTimeZonePrivate *this)

{
  long lVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  Territory in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffda;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
             0x74c5c0);
  QHash<QByteArray,_QTzTimeZone>::value
            ((QHash<QByteArray,_QTzTimeZone> *)
             CONCAT62(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8),in_RDI);
  QTzTimeZone::~QTzTimeZone((QTzTimeZone *)0x74c5ee);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_stack_ffffffffffffffd8;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTzTimeZonePrivate::territory() const
{
    return tzZones->value(m_id).territory;
}